

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O0

void kill_dead_stores(dmr_C *C,pseudo_t pseudo,unsigned_long generation,basic_block *bb,int local)

{
  undefined1 local_98 [8];
  ptr_list_iter childiter__;
  basic_block *child;
  ptr_list_iter parentiter__;
  undefined1 local_58 [4];
  int opcode;
  ptr_list_iter insniter__;
  basic_block *parent;
  instruction *insn;
  int local_local;
  basic_block *bb_local;
  unsigned_long generation_local;
  pseudo_t pseudo_local;
  dmr_C *C_local;
  
  if (bb->generation != generation) {
    bb->generation = generation;
    ptrlist_reverse_iterator((ptr_list_iter *)local_58,(ptr_list *)bb->insns);
    parent = (basic_block *)ptrlist_iter_prev((ptr_list_iter *)local_58);
    while (parent != (basic_block *)0x0) {
      parentiter__._20_4_ = *(uint *)&parent->pos & 0xff;
      if ((parentiter__._20_4_ == 0x29) || (parentiter__._20_4_ == 0x2a)) {
        if (parent->children == (basic_block_list *)pseudo) {
          if (parentiter__._20_4_ == 0x29) {
            return;
          }
          kill_store(C,(instruction *)parent);
        }
        else if ((local == 0) && (*(int *)&parent->children->field_0x4 != 2)) {
          return;
        }
      }
      else if ((local == 0) && (parentiter__._20_4_ == 0x35)) {
        return;
      }
      parent = (basic_block *)ptrlist_iter_prev((ptr_list_iter *)local_58);
    }
    ptrlist_forward_iterator((ptr_list_iter *)&child,(ptr_list *)bb->parents);
    insniter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&child);
    while (insniter__._16_8_ != 0) {
      ptrlist_forward_iterator((ptr_list_iter *)local_98,*(ptr_list **)(insniter__._16_8_ + 0x28));
      childiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_98);
      while (childiter__._16_8_ != 0) {
        if ((childiter__._16_8_ != 0) && ((basic_block *)childiter__._16_8_ != bb)) {
          return;
        }
        childiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_98);
      }
      kill_dead_stores(C,pseudo,generation,(basic_block *)insniter__._16_8_,local);
      insniter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&child);
    }
  }
  return;
}

Assistant:

static void kill_dead_stores(struct dmr_C *C, pseudo_t pseudo, unsigned long generation, struct basic_block *bb, int local)
{
	struct instruction *insn;
	struct basic_block *parent;

	if (bb->generation == generation)
		return;
	bb->generation = generation;
	FOR_EACH_PTR_REVERSE(bb->insns, insn) {
		int opcode = insn->opcode;

		if (opcode != OP_LOAD && opcode != OP_STORE) {
			if (local)
				continue;
			if (opcode == OP_CALL)
				return;
			continue;
		}
		if (insn->src == pseudo) {
			if (opcode == OP_LOAD)
				return;
			kill_store(C, insn);
			continue;
		}
		if (local)
			continue;
		if (insn->src->type != PSEUDO_SYM)
			return;
	} END_FOR_EACH_PTR_REVERSE(insn);

	FOR_EACH_PTR(bb->parents, parent) {
		struct basic_block *child;
		FOR_EACH_PTR(parent->children, child) {
			if (child && child != bb)
				return;
		} END_FOR_EACH_PTR(child);
		kill_dead_stores(C, pseudo, generation, parent, local);
	} END_FOR_EACH_PTR(parent);
}